

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

void JX9_DIR_Const(jx9_value *pVal,void *pUserData)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uint nLen;
  jx9_vm *pVm;
  char *zString;
  long lVar6;
  
  if ((*(int *)((long)pUserData + 0x3f0) == 0) ||
     (lVar2 = *(long *)((long)pUserData + 1000), lVar2 == 0)) {
    jx9_value_string(pVal,":MEMORY:",8);
    return;
  }
  uVar5 = (ulong)(uint)((*(int *)((long)pUserData + 0x3f0) + -1) * *(int *)((long)pUserData + 0x3f8)
                       );
  iVar1 = *(int *)(lVar2 + 8 + uVar5);
  lVar4 = (long)iVar1;
  if (lVar4 != 0) {
    zString = *(char **)(lVar2 + uVar5);
    lVar2 = 0;
    do {
      lVar6 = lVar2;
      if (zString + lVar6 + lVar4 + -1 <= zString) break;
      lVar2 = lVar6 + -1;
    } while (zString[lVar6 + lVar4 + -1] != '/');
    if ((1 - lVar4 != lVar6) || (*zString == '/')) {
      uVar3 = iVar1 + -1 + (int)lVar6;
      nLen = 1;
      if (1 < uVar3) {
        nLen = uVar3;
      }
      if (uVar3 == 0) {
        zString = "/";
      }
      jx9_value_string(pVal,zString,nLen);
      return;
    }
  }
  jx9_value_string(pVal,".",1);
  return;
}

Assistant:

static void JX9_DIR_Const(jx9_value *pVal, void *pUserData)
{
	jx9_vm *pVm = (jx9_vm *)pUserData;
	SyString *pFile;
	/* Peek the top entry */
	pFile = (SyString *)SySetPeek(&pVm->aFiles);
	if( pFile == 0 ){
		/* Expand the magic word: ":MEMORY:" */
		jx9_value_string(pVal, ":MEMORY:", (int)sizeof(":MEMORY:")-1);
	}else{
		if( pFile->nByte > 0 ){
			const char *zDir;
			int nLen;
			zDir = jx9ExtractDirName(pFile->zString, (int)pFile->nByte, &nLen);
			jx9_value_string(pVal, zDir, nLen);
		}else{
			/* Expand '.' as the current directory*/
			jx9_value_string(pVal, ".", (int)sizeof(char));
		}
	}
}